

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O0

char * pstrcat(char *buf,int buf_size,char *s)

{
  int iVar1;
  size_t sVar2;
  char *in_RDX;
  int in_ESI;
  char *in_RDI;
  int len;
  
  sVar2 = strlen(in_RDI);
  iVar1 = (int)sVar2;
  if (iVar1 < in_ESI) {
    pstrcpy(in_RDI + iVar1,in_ESI - iVar1,in_RDX);
  }
  return in_RDI;
}

Assistant:

char *pstrcat(char *buf, int buf_size, const char *s)
{
    int len;
    len = strlen(buf);
    if (len < buf_size)
        pstrcpy(buf + len, buf_size - len, s);
    return buf;
}